

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int mk_sched_threads_purge(mk_sched_worker *sched)

{
  int iVar1;
  mk_list *in_RSI;
  
  iVar1 = sched_thread_cleanup((mk_sched_worker *)&sched->threads_purge,in_RSI);
  return iVar1;
}

Assistant:

int mk_sched_threads_purge(struct mk_sched_worker *sched)
{
    int c = 0;

    c = sched_thread_cleanup(sched, &sched->threads_purge);
    return c;
}